

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hamt_map.cpp
# Opt level: O0

void __thiscall
TwoValuesWithHashCollision_LeafLevelLinearCase_Test::TestBody
          (TwoValuesWithHashCollision_LeafLevelLinearCase_Test *this)

{
  bool bVar1;
  uint generation;
  type phVar2;
  Message *pMVar3;
  char *pcVar4;
  pointer phVar5;
  internal_node *piVar6;
  index_pointer *piVar7;
  address *val1;
  typed_address<pstore::index::details::internal_node> tVar8;
  element_type *peVar9;
  typed_address<pstore::index::details::linear_node> a;
  char *in_R9;
  string local_9a0;
  AssertHelper local_980;
  Message local_978;
  allocator local_969;
  string local_968;
  bool local_941;
  undefined1 local_940 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_910;
  Message local_908;
  allocator local_8f9;
  string local_8f8;
  bool local_8d1;
  undefined1 local_8d0 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_8a0;
  Message local_898;
  allocator local_889;
  string local_888;
  bool local_861;
  undefined1 local_860 [8];
  AssertionResult gtest_ar__4;
  Message local_848;
  uint local_83c;
  size_t local_838;
  undefined1 local_830 [8];
  AssertionResult gtest_ar_3;
  index_pointer local_808;
  pair<std::shared_ptr<const_pstore::index::details::linear_node>,_const_pstore::index::details::linear_node_*>
  local_800;
  linear_node *local_7e8;
  linear_node *level11_linear_1;
  shared_ptr<const_pstore::index::details::linear_node> sptr;
  index_pointer level11;
  undefined1 local_7c0 [8];
  shared_ptr<const_pstore::index::details::internal_node> level10_internal_1;
  index_pointer level10;
  undefined1 local_7a0 [8];
  shared_ptr<const_pstore::index::details::internal_node> level9_internal_1;
  index_pointer level9;
  undefined1 local_780 [8];
  shared_ptr<const_pstore::index::details::internal_node> level8_internal_1;
  index_pointer level8;
  undefined1 local_760 [8];
  shared_ptr<const_pstore::index::details::internal_node> level7_internal_1;
  index_pointer level7;
  undefined1 local_740 [8];
  shared_ptr<const_pstore::index::details::internal_node> level6_internal_1;
  index_pointer level6;
  undefined1 local_720 [8];
  shared_ptr<const_pstore::index::details::internal_node> level5_internal_1;
  index_pointer level5;
  undefined1 local_700 [8];
  shared_ptr<const_pstore::index::details::internal_node> level4_internal_1;
  index_pointer level4;
  undefined1 local_6e0 [8];
  shared_ptr<const_pstore::index::details::internal_node> level3_internal_1;
  index_pointer level3;
  undefined1 local_6c0 [8];
  shared_ptr<const_pstore::index::details::internal_node> level2_internal_1;
  index_pointer level2;
  undefined1 local_6a0 [8];
  shared_ptr<const_pstore::index::details::internal_node> level1_internal_1;
  index_pointer level1;
  undefined1 local_680 [8];
  shared_ptr<const_pstore::index::details::internal_node> root_internal_1;
  index_pointer local_668;
  index_pointer root_1;
  AssertHelper local_658;
  Message local_650;
  address local_648;
  undefined1 local_640 [8];
  AssertionResult gtest_ar_2;
  Message local_628;
  uint local_61c;
  size_t local_618;
  undefined1 local_610 [8];
  AssertionResult gtest_ar_1;
  Message local_5f8;
  uint local_5ec;
  size_t local_5e8;
  undefined1 local_5e0 [8];
  AssertionResult gtest_ar;
  linear_node *level11_linear;
  AssertHelper local_5a8;
  Message local_5a0;
  bool local_591;
  undefined1 local_590 [8];
  AssertionResult gtest_ar__3;
  internal_node *level10_internal;
  internal_node *level9_internal;
  internal_node *level8_internal;
  internal_node *level7_internal;
  internal_node *level6_internal;
  internal_node *level5_internal;
  internal_node *level4_internal;
  internal_node *level3_internal;
  internal_node *level2_internal;
  internal_node *level1_internal;
  internal_node *root_internal;
  index_pointer local_520;
  index_pointer root;
  AssertHelper local_4f8;
  Message local_4f0;
  allocator local_4e1;
  string local_4e0;
  bool local_4b9;
  undefined1 local_4b8 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_488;
  Message local_480;
  allocator local_471;
  string local_470;
  bool local_449;
  undefined1 local_448 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_418;
  Message local_410;
  allocator local_401;
  string local_400;
  bool local_3d9;
  undefined1 local_3d8 [8];
  AssertionResult gtest_ar_;
  string local_3c0;
  pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
  local_3a0;
  allocator local_2a1;
  string local_2a0;
  pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
  local_280;
  allocator local_181;
  string local_180;
  pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
  local_160;
  unique_lock<mock_mutex> local_58;
  undefined1 local_48 [8];
  transaction_type t1;
  TwoValuesWithHashCollision_LeafLevelLinearCase_Test *this_local;
  
  t1.lock_._8_8_ = this;
  std::unique_lock<mock_mutex>::unique_lock
            (&local_58,
             (mutex_type *)
             &(this->super_TwoValuesWithHashCollision).super_GenericIndexFixture.super_IndexFixture.
              field_0x10);
  ::begin((transaction<std::unique_lock<mock_mutex>_> *)local_48,
          &(this->super_TwoValuesWithHashCollision).super_GenericIndexFixture.super_IndexFixture.db_
          ,&local_58);
  std::unique_lock<mock_mutex>::~unique_lock(&local_58);
  phVar2 = std::
           unique_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator*(&(this->super_TwoValuesWithHashCollision).index_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_180,"g",&local_181);
  anon_unknown.dwarf_10ddcf::GenericIndexFixture::insert_or_assign
            (&local_160,phVar2,(transaction_type *)local_48,&local_180);
  std::
  pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
  ::~pair(&local_160);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  phVar2 = std::
           unique_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator*(&(this->super_TwoValuesWithHashCollision).index_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2a0,"h",&local_2a1);
  anon_unknown.dwarf_10ddcf::GenericIndexFixture::insert_or_assign
            (&local_280,phVar2,(transaction_type *)local_48,&local_2a0);
  std::
  pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
  ::~pair(&local_280);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  phVar2 = std::
           unique_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator*(&(this->super_TwoValuesWithHashCollision).index_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_3c0,"i",
             (allocator *)
             ((long)&gtest_ar_.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  anon_unknown.dwarf_10ddcf::GenericIndexFixture::insert_or_assign
            (&local_3a0,phVar2,(transaction_type *)local_48,&local_3c0);
  std::
  pair<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::iterator_base<false>,_bool>
  ::~pair(&local_3a0);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar_.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  phVar2 = std::
           unique_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator*(&(this->super_TwoValuesWithHashCollision).index_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_400,"g",&local_401);
  local_3d9 = anon_unknown.dwarf_10ddcf::GenericIndexFixture::is_found
                        ((GenericIndexFixture *)this,phVar2,&local_400);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3d8,&local_3d9,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_400);
  std::allocator<char>::~allocator((allocator<char> *)&local_401);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d8);
  if (!bVar1) {
    testing::Message::Message(&local_410);
    pMVar3 = testing::Message::operator<<
                       (&local_410,(char (*) [46])"key \'g\' should be present in the index (heap)")
    ;
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_3d8,
               (AssertionResult *)"this->is_found (*index_, \"g\")","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_418,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x496,pcVar4);
    testing::internal::AssertHelper::operator=(&local_418,pMVar3);
    testing::internal::AssertHelper::~AssertHelper(&local_418);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_410);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d8);
  phVar2 = std::
           unique_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator*(&(this->super_TwoValuesWithHashCollision).index_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_470,"h",&local_471);
  local_449 = anon_unknown.dwarf_10ddcf::GenericIndexFixture::is_found
                        ((GenericIndexFixture *)this,phVar2,&local_470);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_448,&local_449,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_470);
  std::allocator<char>::~allocator((allocator<char> *)&local_471);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_448);
  if (!bVar1) {
    testing::Message::Message(&local_480);
    pMVar3 = testing::Message::operator<<
                       (&local_480,(char (*) [46])"key \'h\' should be present in the index (heap)")
    ;
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_448,
               (AssertionResult *)"this->is_found (*index_, \"h\")","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_488,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x497,pcVar4);
    testing::internal::AssertHelper::operator=(&local_488,pMVar3);
    testing::internal::AssertHelper::~AssertHelper(&local_488);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_480);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_448);
  phVar2 = std::
           unique_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator*(&(this->super_TwoValuesWithHashCollision).index_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4e0,"i",&local_4e1);
  local_4b9 = anon_unknown.dwarf_10ddcf::GenericIndexFixture::is_found
                        ((GenericIndexFixture *)this,phVar2,&local_4e0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4b8,&local_4b9,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_4e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4e1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b8);
  if (!bVar1) {
    testing::Message::Message(&local_4f0);
    pMVar3 = testing::Message::operator<<
                       (&local_4f0,(char (*) [46])"key \'i\' should be present in the index (heap)")
    ;
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&root.addr_,(internal *)local_4b8,
               (AssertionResult *)"this->is_found (*index_, \"i\")","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_4f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x498,pcVar4);
    testing::internal::AssertHelper::operator=(&local_4f8,pMVar3);
    testing::internal::AssertHelper::~AssertHelper(&local_4f8);
    std::__cxx11::string::~string((string *)&root.addr_);
    testing::Message::~Message(&local_4f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b8);
  phVar5 = std::
           unique_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator->(&(this->super_TwoValuesWithHashCollision).index_);
  local_520 = pstore::index::
              hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::root(phVar5);
  anon_unknown.dwarf_10ddcf::GenericIndexFixture::check_is_heap_internal_node
            ((GenericIndexFixture *)this,local_520);
  piVar6 = pstore::index::details::index_pointer::untag<pstore::index::details::internal_node*,void>
                     ((index_pointer *)&local_520.addr_);
  piVar7 = pstore::index::details::internal_node::operator[](piVar6,0);
  piVar6 = pstore::index::details::index_pointer::untag<pstore::index::details::internal_node*,void>
                     ((index_pointer *)&piVar7->addr_);
  piVar7 = pstore::index::details::internal_node::operator[](piVar6,0);
  piVar6 = pstore::index::details::index_pointer::untag<pstore::index::details::internal_node*,void>
                     ((index_pointer *)&piVar7->addr_);
  piVar7 = pstore::index::details::internal_node::operator[](piVar6,0);
  piVar6 = pstore::index::details::index_pointer::untag<pstore::index::details::internal_node*,void>
                     ((index_pointer *)&piVar7->addr_);
  piVar7 = pstore::index::details::internal_node::operator[](piVar6,0);
  piVar6 = pstore::index::details::index_pointer::untag<pstore::index::details::internal_node*,void>
                     ((index_pointer *)&piVar7->addr_);
  piVar7 = pstore::index::details::internal_node::operator[](piVar6,0);
  piVar6 = pstore::index::details::index_pointer::untag<pstore::index::details::internal_node*,void>
                     ((index_pointer *)&piVar7->addr_);
  piVar7 = pstore::index::details::internal_node::operator[](piVar6,0);
  piVar6 = pstore::index::details::index_pointer::untag<pstore::index::details::internal_node*,void>
                     ((index_pointer *)&piVar7->addr_);
  piVar7 = pstore::index::details::internal_node::operator[](piVar6,0);
  piVar6 = pstore::index::details::index_pointer::untag<pstore::index::details::internal_node*,void>
                     ((index_pointer *)&piVar7->addr_);
  piVar7 = pstore::index::details::internal_node::operator[](piVar6,0);
  piVar6 = pstore::index::details::index_pointer::untag<pstore::index::details::internal_node*,void>
                     ((index_pointer *)&piVar7->addr_);
  piVar7 = pstore::index::details::internal_node::operator[](piVar6,0);
  piVar6 = pstore::index::details::index_pointer::untag<pstore::index::details::internal_node*,void>
                     ((index_pointer *)&piVar7->addr_);
  piVar7 = pstore::index::details::internal_node::operator[](piVar6,0);
  gtest_ar__3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )pstore::index::details::index_pointer::untag<pstore::index::details::internal_node*,void>
                   ((index_pointer *)&piVar7->addr_);
  piVar7 = pstore::index::details::internal_node::operator[]
                     ((internal_node *)
                      gtest_ar__3.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl,0);
  local_591 = pstore::index::details::index_pointer::is_linear((index_pointer *)&piVar7->addr_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_590,&local_591,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_590);
  if (!bVar1) {
    testing::Message::Message(&local_5a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&level11_linear,(internal *)local_590,
               (AssertionResult *)"(*level10_internal)[0].is_linear ()","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_5a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x4a9,pcVar4);
    testing::internal::AssertHelper::operator=(&local_5a8,&local_5a0);
    testing::internal::AssertHelper::~AssertHelper(&local_5a8);
    std::__cxx11::string::~string((string *)&level11_linear);
    testing::Message::~Message(&local_5a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_590);
  piVar7 = pstore::index::details::internal_node::operator[]
                     ((internal_node *)
                      gtest_ar__3.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl,0);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )pstore::index::details::index_pointer::untag<pstore::index::details::linear_node*,void>
                   ((index_pointer *)&piVar7->addr_);
  local_5e8 = pstore::index::details::linear_node::size
                        ((linear_node *)
                         gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  local_5ec = 3;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_5e0,"level11_linear->size ()","3U",&local_5e8,&local_5ec);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5e0);
  if (!bVar1) {
    testing::Message::Message(&local_5f8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_5e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x4ab,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_5f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_5f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5e0);
  local_618 = pstore::index::details::linear_node::size_bytes
                        ((linear_node *)
                         gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl);
  local_61c = 0x28;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_610,"level11_linear->size_bytes ()","40U",&local_618,&local_61c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_610);
  if (!bVar1) {
    testing::Message::Message(&local_628);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_610);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x4ac,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_628);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_628);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_610);
  val1 = pstore::index::details::linear_node::operator[]
                   ((linear_node *)
                    gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl,0);
  local_648 = pstore::address::null();
  testing::internal::CmpHelperNE<pstore::address,pstore::address>
            ((internal *)local_640,"(*level11_linear)[0]","pstore::address::null ()",val1,&local_648
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_640);
  if (!bVar1) {
    testing::Message::Message(&local_650);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_640);
    testing::internal::AssertHelper::AssertHelper
              (&local_658,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x4ad,pcVar4);
    testing::internal::AssertHelper::operator=(&local_658,&local_650);
    testing::internal::AssertHelper::~AssertHelper(&local_658);
    testing::Message::~Message(&local_650);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_640);
  phVar5 = std::
           unique_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator->(&(this->super_TwoValuesWithHashCollision).index_);
  generation = pstore::database::get_current_revision
                         (&(this->super_TwoValuesWithHashCollision).super_GenericIndexFixture.
                           super_IndexFixture.db_);
  root_1.addr_.a_ =
       (address)pstore::index::
                hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::flush(phVar5,(transaction_base *)local_48,generation);
  phVar5 = std::
           unique_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator->(&(this->super_TwoValuesWithHashCollision).index_);
  root_internal_1.
  super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       pstore::index::
       hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::root(phVar5);
  local_668 = (index_pointer)
              root_internal_1.
              super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi;
  anon_unknown.dwarf_10ddcf::GenericIndexFixture::check_is_store_internal_node
            ((GenericIndexFixture *)this,
             (index_pointer)
             root_internal_1.
             super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi);
  tVar8 = pstore::index::details::index_pointer::
          untag_address<pstore::index::details::internal_node,void>
                    ((index_pointer *)&local_668.addr_);
  pstore::index::details::internal_node::read_node
            ((internal_node *)local_680,
             &(this->super_TwoValuesWithHashCollision).super_GenericIndexFixture.super_IndexFixture.
              db_,tVar8);
  peVar9 = std::
           __shared_ptr_access<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_680);
  piVar7 = pstore::index::details::internal_node::operator[](peVar9,0);
  level1_internal_1.
  super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(piVar7->addr_).a_;
  tVar8 = pstore::index::details::index_pointer::
          untag_address<pstore::index::details::internal_node,void>
                    ((index_pointer *)
                     &level1_internal_1.
                      super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
  pstore::index::details::internal_node::read_node
            ((internal_node *)local_6a0,
             &(this->super_TwoValuesWithHashCollision).super_GenericIndexFixture.super_IndexFixture.
              db_,tVar8);
  peVar9 = std::
           __shared_ptr_access<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_6a0);
  piVar7 = pstore::index::details::internal_node::operator[](peVar9,0);
  level2_internal_1.
  super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(piVar7->addr_).a_;
  tVar8 = pstore::index::details::index_pointer::
          untag_address<pstore::index::details::internal_node,void>
                    ((index_pointer *)
                     &level2_internal_1.
                      super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
  pstore::index::details::internal_node::read_node
            ((internal_node *)local_6c0,
             &(this->super_TwoValuesWithHashCollision).super_GenericIndexFixture.super_IndexFixture.
              db_,tVar8);
  peVar9 = std::
           __shared_ptr_access<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_6c0);
  piVar7 = pstore::index::details::internal_node::operator[](peVar9,0);
  level3_internal_1.
  super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(piVar7->addr_).a_;
  tVar8 = pstore::index::details::index_pointer::
          untag_address<pstore::index::details::internal_node,void>
                    ((index_pointer *)
                     &level3_internal_1.
                      super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
  pstore::index::details::internal_node::read_node
            ((internal_node *)local_6e0,
             &(this->super_TwoValuesWithHashCollision).super_GenericIndexFixture.super_IndexFixture.
              db_,tVar8);
  peVar9 = std::
           __shared_ptr_access<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_6e0);
  piVar7 = pstore::index::details::internal_node::operator[](peVar9,0);
  level4_internal_1.
  super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(piVar7->addr_).a_;
  tVar8 = pstore::index::details::index_pointer::
          untag_address<pstore::index::details::internal_node,void>
                    ((index_pointer *)
                     &level4_internal_1.
                      super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
  pstore::index::details::internal_node::read_node
            ((internal_node *)local_700,
             &(this->super_TwoValuesWithHashCollision).super_GenericIndexFixture.super_IndexFixture.
              db_,tVar8);
  peVar9 = std::
           __shared_ptr_access<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_700);
  piVar7 = pstore::index::details::internal_node::operator[](peVar9,0);
  level5_internal_1.
  super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(piVar7->addr_).a_;
  tVar8 = pstore::index::details::index_pointer::
          untag_address<pstore::index::details::internal_node,void>
                    ((index_pointer *)
                     &level5_internal_1.
                      super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
  pstore::index::details::internal_node::read_node
            ((internal_node *)local_720,
             &(this->super_TwoValuesWithHashCollision).super_GenericIndexFixture.super_IndexFixture.
              db_,tVar8);
  peVar9 = std::
           __shared_ptr_access<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_720);
  piVar7 = pstore::index::details::internal_node::operator[](peVar9,0);
  level6_internal_1.
  super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(piVar7->addr_).a_;
  tVar8 = pstore::index::details::index_pointer::
          untag_address<pstore::index::details::internal_node,void>
                    ((index_pointer *)
                     &level6_internal_1.
                      super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
  pstore::index::details::internal_node::read_node
            ((internal_node *)local_740,
             &(this->super_TwoValuesWithHashCollision).super_GenericIndexFixture.super_IndexFixture.
              db_,tVar8);
  peVar9 = std::
           __shared_ptr_access<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_740);
  piVar7 = pstore::index::details::internal_node::operator[](peVar9,0);
  level7_internal_1.
  super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(piVar7->addr_).a_;
  tVar8 = pstore::index::details::index_pointer::
          untag_address<pstore::index::details::internal_node,void>
                    ((index_pointer *)
                     &level7_internal_1.
                      super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
  pstore::index::details::internal_node::read_node
            ((internal_node *)local_760,
             &(this->super_TwoValuesWithHashCollision).super_GenericIndexFixture.super_IndexFixture.
              db_,tVar8);
  peVar9 = std::
           __shared_ptr_access<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_760);
  piVar7 = pstore::index::details::internal_node::operator[](peVar9,0);
  level8_internal_1.
  super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(piVar7->addr_).a_;
  tVar8 = pstore::index::details::index_pointer::
          untag_address<pstore::index::details::internal_node,void>
                    ((index_pointer *)
                     &level8_internal_1.
                      super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
  pstore::index::details::internal_node::read_node
            ((internal_node *)local_780,
             &(this->super_TwoValuesWithHashCollision).super_GenericIndexFixture.super_IndexFixture.
              db_,tVar8);
  peVar9 = std::
           __shared_ptr_access<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_780);
  piVar7 = pstore::index::details::internal_node::operator[](peVar9,0);
  level9_internal_1.
  super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(piVar7->addr_).a_;
  tVar8 = pstore::index::details::index_pointer::
          untag_address<pstore::index::details::internal_node,void>
                    ((index_pointer *)
                     &level9_internal_1.
                      super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
  pstore::index::details::internal_node::read_node
            ((internal_node *)local_7a0,
             &(this->super_TwoValuesWithHashCollision).super_GenericIndexFixture.super_IndexFixture.
              db_,tVar8);
  peVar9 = std::
           __shared_ptr_access<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_7a0);
  piVar7 = pstore::index::details::internal_node::operator[](peVar9,0);
  level10_internal_1.
  super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(piVar7->addr_).a_;
  tVar8 = pstore::index::details::index_pointer::
          untag_address<pstore::index::details::internal_node,void>
                    ((index_pointer *)
                     &level10_internal_1.
                      super___shared_ptr<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
  pstore::index::details::internal_node::read_node
            ((internal_node *)local_7c0,
             &(this->super_TwoValuesWithHashCollision).super_GenericIndexFixture.super_IndexFixture.
              db_,tVar8);
  peVar9 = std::
           __shared_ptr_access<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<const_pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_7c0);
  piVar7 = pstore::index::details::internal_node::operator[](peVar9,0);
  sptr.super___shared_ptr<const_pstore::index::details::linear_node,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(piVar7->addr_).a_;
  std::shared_ptr<const_pstore::index::details::linear_node>::shared_ptr
            ((shared_ptr<const_pstore::index::details::linear_node> *)&level11_linear_1);
  local_7e8 = (linear_node *)0x0;
  a = pstore::index::details::index_pointer::untag_address<pstore::index::details::linear_node,void>
                ((index_pointer *)
                 &sptr.
                  super___shared_ptr<const_pstore::index::details::linear_node,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
  pstore::index::details::index_pointer::index_pointer((index_pointer *)&local_808.addr_,a);
  pstore::index::details::linear_node::get_node
            (&local_800,
             &(this->super_TwoValuesWithHashCollision).super_GenericIndexFixture.super_IndexFixture.
              db_,local_808);
  std::
  tie<std::shared_ptr<pstore::index::details::linear_node_const>,pstore::index::details::linear_node_const*>
            ((shared_ptr<const_pstore::index::details::linear_node> *)&gtest_ar_3.message_,
             &level11_linear_1);
  std::
  tuple<std::shared_ptr<pstore::index::details::linear_node_const>&,pstore::index::details::linear_node_const*&>
  ::operator=((tuple<std::shared_ptr<pstore::index::details::linear_node_const>&,pstore::index::details::linear_node_const*&>
               *)&gtest_ar_3.message_,&local_800);
  std::
  pair<std::shared_ptr<const_pstore::index::details::linear_node>,_const_pstore::index::details::linear_node_*>
  ::~pair(&local_800);
  local_838 = pstore::index::details::linear_node::size(local_7e8);
  local_83c = 3;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_830,"level11_linear->size ()","3U",&local_838,&local_83c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_830);
  if (!bVar1) {
    testing::Message::Message(&local_848);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_830);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x4dc,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4.message_,&local_848);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_848);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_830);
  phVar2 = std::
           unique_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator*(&(this->super_TwoValuesWithHashCollision).index_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_888,"g",&local_889);
  local_861 = anon_unknown.dwarf_10ddcf::GenericIndexFixture::is_found
                        ((GenericIndexFixture *)this,phVar2,&local_888);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_860,&local_861,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_888);
  std::allocator<char>::~allocator((allocator<char> *)&local_889);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_860);
  if (!bVar1) {
    testing::Message::Message(&local_898);
    pMVar3 = testing::Message::operator<<
                       (&local_898,(char (*) [47])"key \'g\' should be present in the index (store)"
                       );
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_860,
               (AssertionResult *)"this->is_found (*index_, \"g\")","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_8a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x4dd,pcVar4);
    testing::internal::AssertHelper::operator=(&local_8a0,pMVar3);
    testing::internal::AssertHelper::~AssertHelper(&local_8a0);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_898);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_860);
  phVar2 = std::
           unique_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator*(&(this->super_TwoValuesWithHashCollision).index_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_8f8,"h",&local_8f9);
  local_8d1 = anon_unknown.dwarf_10ddcf::GenericIndexFixture::is_found
                        ((GenericIndexFixture *)this,phVar2,&local_8f8);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_8d0,&local_8d1,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_8f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8f9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8d0);
  if (!bVar1) {
    testing::Message::Message(&local_908);
    pMVar3 = testing::Message::operator<<
                       (&local_908,(char (*) [47])"key \'h\' should be present in the index (store)"
                       );
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_8d0,
               (AssertionResult *)"this->is_found (*index_, \"h\")","false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_910,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x4df,pcVar4);
    testing::internal::AssertHelper::operator=(&local_910,pMVar3);
    testing::internal::AssertHelper::~AssertHelper(&local_910);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_908);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8d0);
  phVar2 = std::
           unique_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::operator*(&(this->super_TwoValuesWithHashCollision).index_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_968,"i",&local_969);
  local_941 = anon_unknown.dwarf_10ddcf::GenericIndexFixture::is_found
                        ((GenericIndexFixture *)this,phVar2,&local_968);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_940,&local_941,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_968);
  std::allocator<char>::~allocator((allocator<char> *)&local_969);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_940);
  if (!bVar1) {
    testing::Message::Message(&local_978);
    pMVar3 = testing::Message::operator<<
                       (&local_978,(char (*) [47])"key \'i\' should be present in the index (store)"
                       );
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_9a0,(internal *)local_940,(AssertionResult *)"this->is_found (*index_, \"i\")"
               ,"false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_980,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_hamt_map.cpp"
               ,0x4e1,pcVar4);
    testing::internal::AssertHelper::operator=(&local_980,pMVar3);
    testing::internal::AssertHelper::~AssertHelper(&local_980);
    std::__cxx11::string::~string((string *)&local_9a0);
    testing::Message::~Message(&local_978);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_940);
  std::shared_ptr<const_pstore::index::details::linear_node>::~shared_ptr
            ((shared_ptr<const_pstore::index::details::linear_node> *)&level11_linear_1);
  std::shared_ptr<const_pstore::index::details::internal_node>::~shared_ptr
            ((shared_ptr<const_pstore::index::details::internal_node> *)local_7c0);
  std::shared_ptr<const_pstore::index::details::internal_node>::~shared_ptr
            ((shared_ptr<const_pstore::index::details::internal_node> *)local_7a0);
  std::shared_ptr<const_pstore::index::details::internal_node>::~shared_ptr
            ((shared_ptr<const_pstore::index::details::internal_node> *)local_780);
  std::shared_ptr<const_pstore::index::details::internal_node>::~shared_ptr
            ((shared_ptr<const_pstore::index::details::internal_node> *)local_760);
  std::shared_ptr<const_pstore::index::details::internal_node>::~shared_ptr
            ((shared_ptr<const_pstore::index::details::internal_node> *)local_740);
  std::shared_ptr<const_pstore::index::details::internal_node>::~shared_ptr
            ((shared_ptr<const_pstore::index::details::internal_node> *)local_720);
  std::shared_ptr<const_pstore::index::details::internal_node>::~shared_ptr
            ((shared_ptr<const_pstore::index::details::internal_node> *)local_700);
  std::shared_ptr<const_pstore::index::details::internal_node>::~shared_ptr
            ((shared_ptr<const_pstore::index::details::internal_node> *)local_6e0);
  std::shared_ptr<const_pstore::index::details::internal_node>::~shared_ptr
            ((shared_ptr<const_pstore::index::details::internal_node> *)local_6c0);
  std::shared_ptr<const_pstore::index::details::internal_node>::~shared_ptr
            ((shared_ptr<const_pstore::index::details::internal_node> *)local_6a0);
  std::shared_ptr<const_pstore::index::details::internal_node>::~shared_ptr
            ((shared_ptr<const_pstore::index::details::internal_node> *)local_680);
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)local_48);
  return;
}

Assistant:

TEST_F (TwoValuesWithHashCollision, LeafLevelLinearCase) {
    transaction_type t1 = begin (db_, lock_guard{mutex_});

    //
    //              +--------+
    // root_ ->     | 000000 |       (hash bits 0-5)
    //              +--------+
    //                   |
    //                   :
    //                   |
    //                   v
    //              +--------+
    // level10 ->   |  0000  |       (hash bits 60-63)
    //              +--------+
    //                   |
    //                   v
    //            +---+---+---+
    // level11 -> | 0 | 1 | 2 |
    //            +---+---+---+
    //              |   |   |
    //              v   |   |
    //             "g"  v   |          ( 0 )
    //                 "h"  v          ( 0 )
    //                     "i"         ( 0 )

    this->insert_or_assign (*index_, t1, "g");
    this->insert_or_assign (*index_, t1, "h");
    this->insert_or_assign (*index_, t1, "i");
    EXPECT_TRUE (this->is_found (*index_, "g")) << "key 'g' should be present in the index (heap)";
    EXPECT_TRUE (this->is_found (*index_, "h")) << "key 'h' should be present in the index (heap)";
    EXPECT_TRUE (this->is_found (*index_, "i")) << "key 'i' should be present in the index (heap)";
    {
        // Check that the trie was laid out as we expected in the heap.
        index_pointer root = index_->root ();
        this->check_is_heap_internal_node (root);

        auto const root_internal = root.untag<internal_node *> ();
        auto const level1_internal = (*root_internal)[0].untag<internal_node *> ();
        auto const level2_internal = (*level1_internal)[0].untag<internal_node *> ();
        auto const level3_internal = (*level2_internal)[0].untag<internal_node *> ();
        auto const level4_internal = (*level3_internal)[0].untag<internal_node *> ();
        auto const level5_internal = (*level4_internal)[0].untag<internal_node *> ();
        auto const level6_internal = (*level5_internal)[0].untag<internal_node *> ();
        auto const level7_internal = (*level6_internal)[0].untag<internal_node *> ();
        auto const level8_internal = (*level7_internal)[0].untag<internal_node *> ();
        auto const level9_internal = (*level8_internal)[0].untag<internal_node *> ();
        auto const level10_internal = (*level9_internal)[0].untag<internal_node *> ();
        EXPECT_TRUE ((*level10_internal)[0].is_linear ());
        auto const level11_linear = (*level10_internal)[0].untag<linear_node *> ();
        EXPECT_EQ (level11_linear->size (), 3U);
        EXPECT_EQ (level11_linear->size_bytes (), 40U);
        EXPECT_NE ((*level11_linear)[0], pstore::address::null ());
        index_->flush (t1, db_.get_current_revision ());
    }
    {
        // Check that the trie was laid out as we expected in the store.
        index_pointer root = index_->root ();
        this->check_is_store_internal_node (root);

        auto const root_internal =
            internal_node::read_node (db_, root.untag_address<internal_node> ());
        auto const level1 = (*root_internal)[0];
        auto const level1_internal =
            internal_node::read_node (db_, level1.untag_address<internal_node> ());
        auto const level2 = (*level1_internal)[0];
        auto const level2_internal =
            internal_node::read_node (db_, level2.untag_address<internal_node> ());
        auto const level3 = (*level2_internal)[0];
        auto const level3_internal =
            internal_node::read_node (db_, level3.untag_address<internal_node> ());
        auto const level4 = (*level3_internal)[0];
        auto const level4_internal =
            internal_node::read_node (db_, level4.untag_address<internal_node> ());
        auto const level5 = (*level4_internal)[0];
        auto const level5_internal =
            internal_node::read_node (db_, level5.untag_address<internal_node> ());
        auto const level6 = (*level5_internal)[0];
        auto const level6_internal =
            internal_node::read_node (db_, level6.untag_address<internal_node> ());
        auto const level7 = (*level6_internal)[0];
        auto const level7_internal =
            internal_node::read_node (db_, level7.untag_address<internal_node> ());
        auto const level8 = (*level7_internal)[0];
        auto const level8_internal =
            internal_node::read_node (db_, level8.untag_address<internal_node> ());
        auto const level9 = (*level8_internal)[0];
        auto const level9_internal =
            internal_node::read_node (db_, level9.untag_address<internal_node> ());
        auto const level10 = (*level9_internal)[0];
        auto const level10_internal =
            internal_node::read_node (db_, level10.untag_address<internal_node> ());
        auto const level11 = (*level10_internal)[0];

        std::shared_ptr<linear_node const> sptr;
        linear_node const * level11_linear = nullptr;
        std::tie (sptr, level11_linear) =
            linear_node::get_node (db_, index_pointer{level11.untag_address<linear_node> ()});

        EXPECT_EQ (level11_linear->size (), 3U);
        EXPECT_TRUE (this->is_found (*index_, "g"))
            << "key 'g' should be present in the index (store)";
        EXPECT_TRUE (this->is_found (*index_, "h"))
            << "key 'h' should be present in the index (store)";
        EXPECT_TRUE (this->is_found (*index_, "i"))
            << "key 'i' should be present in the index (store)";
    }
}